

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void AnalyzeEnumConstants
               (ExpressionContext *ctx,TypeBase *type,IntrusiveList<SynConstant> constants,
               IntrusiveList<ConstantData> *target)

{
  long lVar1;
  SynIdentifier *name;
  bool bVar2;
  ExprBase *pEVar3;
  ConstantData *this;
  ExprIntegerLiteral *this_00;
  IntrusiveList<ConstantData> *pIVar4;
  InplaceStr name_00;
  ConstantData *local_58;
  ConstantData *curr;
  ExprBase *rhs;
  ExprIntegerLiteral *value;
  SynConstant *constant;
  ExprIntegerLiteral *last;
  IntrusiveList<ConstantData> *target_local;
  TypeBase *type_local;
  ExpressionContext *ctx_local;
  IntrusiveList<SynConstant> constants_local;
  
  value = (ExprIntegerLiteral *)constants.head;
  constant = (SynConstant *)0x0;
  pIVar4 = target;
  do {
    if (value == (ExprIntegerLiteral *)0x0) {
      return;
    }
    if (value[1].super_ExprBase.source == (SynBase *)0x0) {
      if (constant == (SynConstant *)0x0) {
        rhs = &ExpressionContext::get<ExprIntegerLiteral>(ctx)->super_ExprBase;
        ExprIntegerLiteral::ExprIntegerLiteral
                  ((ExprIntegerLiteral *)rhs,(SynBase *)value,ctx->typeInt,0);
      }
      else {
        rhs = &ExpressionContext::get<ExprIntegerLiteral>(ctx)->super_ExprBase;
        ExprIntegerLiteral::ExprIntegerLiteral
                  ((ExprIntegerLiteral *)rhs,(SynBase *)value,ctx->typeInt,
                   (longlong)((long)&((constant->super_SynBase).next)->_vptr_SynBase + 1));
      }
LAB_001b226b:
      if (rhs == (ExprBase *)0x0) {
        anon_unknown.dwarf_6f1cc::Report
                  (ctx,(SynBase *)value,"ERROR: expression didn\'t evaluate to a constant number");
        rhs = &ExpressionContext::get<ExprIntegerLiteral>(ctx)->super_ExprBase;
        ExprIntegerLiteral::ExprIntegerLiteral
                  ((ExprIntegerLiteral *)rhs,(SynBase *)value,ctx->typeInt,0);
      }
      constant = (SynConstant *)rhs;
      for (local_58 = target->head; local_58 != (ConstantData *)0x0; local_58 = local_58->next) {
        bVar2 = InplaceStr::operator==
                          ((InplaceStr *)(*(long *)&value[1].super_ExprBase.typeID + 0x40),
                           &local_58->name->name);
        if (bVar2) {
          pIVar4 = (IntrusiveList<ConstantData> *)(local_58->name->name).begin;
          anon_unknown.dwarf_6f1cc::Report
                    (ctx,(SynBase *)value,"ERROR: name \'%.*s\' is already taken",
                     (ulong)(uint)((int)(local_58->name->name).end -
                                  (int)(local_58->name->name).begin));
        }
      }
      lVar1 = *(long *)&value[1].super_ExprBase.typeID;
      name_00.end = (char *)pIVar4;
      name_00.begin = *(char **)(lVar1 + 0x48);
      anon_unknown.dwarf_6f1cc::CheckVariableConflict
                ((anon_unknown_dwarf_6f1cc *)ctx,(ExpressionContext *)value,
                 *(SynBase **)(lVar1 + 0x40),name_00);
      this = ExpressionContext::get<ConstantData>(ctx);
      name = *(SynIdentifier **)&value[1].super_ExprBase.typeID;
      this_00 = ExpressionContext::get<ExprIntegerLiteral>(ctx);
      ExprIntegerLiteral::ExprIntegerLiteral
                (this_00,(SynBase *)value,type,(longlong)rhs[1]._vptr_ExprBase);
      ConstantData::ConstantData(this,name,&this_00->super_ExprBase);
      IntrusiveList<ConstantData>::push_back(target,this);
    }
    else {
      pEVar3 = AnalyzeExpression(ctx,value[1].super_ExprBase.source);
      bVar2 = isType<TypeError>(pEVar3->type);
      if (!bVar2) {
        if (pEVar3->type == type) {
          pEVar3 = anon_unknown.dwarf_6f1cc::EvaluateExpression(ctx,(SynBase *)value,pEVar3);
          rhs = &getType<ExprIntegerLiteral>(pEVar3)->super_ExprBase;
        }
        else {
          pIVar4 = (IntrusiveList<ConstantData> *)0x0;
          pEVar3 = CreateCast(ctx,(SynBase *)value,pEVar3,ctx->typeInt,false);
          pEVar3 = anon_unknown.dwarf_6f1cc::EvaluateExpression(ctx,(SynBase *)value,pEVar3);
          rhs = &getType<ExprIntegerLiteral>(pEVar3)->super_ExprBase;
        }
        goto LAB_001b226b;
      }
    }
    value = (ExprIntegerLiteral *)getType<SynConstant>((SynBase *)value->value);
  } while( true );
}

Assistant:

void AnalyzeEnumConstants(ExpressionContext &ctx, TypeBase *type, IntrusiveList<SynConstant> constants, IntrusiveList<ConstantData> &target)
{
	ExprIntegerLiteral *last = NULL;

	for(SynConstant *constant = constants.head; constant; constant = getType<SynConstant>(constant->next))
	{
		ExprIntegerLiteral *value = NULL;
			
		if(constant->value)
		{
			ExprBase *rhs = AnalyzeExpression(ctx, constant->value);

			if(isType<TypeError>(rhs->type))
				continue;

			if(rhs->type == type)
				value = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, constant, rhs));
			else
				value = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, constant, CreateCast(ctx, constant, rhs, ctx.typeInt, false)));
		}
		else if(last)
		{
			value = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(constant, ctx.typeInt, last->value + 1);
		}
		else
		{
			value = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(constant, ctx.typeInt, 0);
		}

		if(!value)
		{
			Report(ctx, constant, "ERROR: expression didn't evaluate to a constant number");

			value = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(constant, ctx.typeInt, 0);
		}

		last = value;

		for(ConstantData *curr = target.head; curr; curr = curr->next)
		{
			if(constant->name->name == curr->name->name)
				Report(ctx, constant, "ERROR: name '%.*s' is already taken", FMT_ISTR(curr->name->name));
		}

		CheckVariableConflict(ctx, constant, constant->name->name);

		target.push_back(new (ctx.get<ConstantData>()) ConstantData(constant->name, new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(constant, type, value->value)));
	}
}